

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O3

void find_median<signed_char>
               (vector<signed_char,_std::allocator<signed_char>_> *numbers,VectorData *vd)

{
  undefined2 uVar1;
  char *pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 uVar10;
  undefined1 auVar9 [16];
  vector<signed_char,_std::allocator<signed_char>_> numbers_copy;
  vector<signed_char,_std::allocator<signed_char>_> local_38;
  
  pcVar2 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pcVar2 == 1) {
    vd->median = (double)(int)*pcVar2;
  }
  else {
    std::vector<signed_char,_std::allocator<signed_char>_>::vector(&local_38,numbers);
    pcVar3 = local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar5 = 0x3f;
      if ((long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        for (; (ulong)((long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> lVar5 == 0;
            lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pcVar3,local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    }
    pcVar3 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = (ulong)((long)pcVar4 - (long)pcVar3) >> 1;
    uVar7 = (long)pcVar4 - (long)pcVar3;
    if (uVar7 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001046f1:
      uVar6 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      if (local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar6);
    }
    vd->median = (double)(int)pcVar3[uVar8];
    if ((uVar7 & 1) == 0) {
      uVar8 = uVar8 - 1;
      if (uVar7 <= uVar8) goto LAB_001046f1;
      uVar1 = *(undefined2 *)(pcVar3 + uVar8);
      uVar10 = (undefined1)((ushort)uVar1 >> 8);
      auVar9 = ZEXT416(CONCAT22((short)(CONCAT13(uVar10,CONCAT12(uVar10,uVar1)) >> 0x10),
                                CONCAT11((char)uVar1,(char)uVar1)));
      auVar9 = pshuflw(auVar9,auVar9,0x60);
      vd->median = ((double)(auVar9._4_4_ >> 0x18) + (double)(auVar9._0_4_ >> 0x18)) * 0.5;
    }
    if (local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void find_median(const std::vector<Number>& numbers,
	VectorData& vd)
{
	if (numbers.size() == 1)
	{
		vd.median = numbers.at(0);
		return;
	}

	std::vector<Number> numbers_copy(numbers);
	std::sort(numbers_copy.begin(), numbers_copy.end());

	size_t pos = numbers.size() / 2;
	vd.median = numbers.at(pos);

	if (numbers.size() % 2 == 0)
	{
		double upper = numbers.at(pos);
		double lower = numbers.at(pos - 1);
		vd.median = (upper + lower) / 2.0;
	}
}